

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

bool __thiscall
iutest::detail::ContainsMatcher<iutest::detail::ContainsMatcher<iutest::detail::LtMatcher<int>>>::
Contains<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
          (ContainsMatcher<iutest::detail::ContainsMatcher<iutest::detail::LtMatcher<int>>> *this,
          __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          begin,__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                end)

{
  char cVar1;
  AssertionResult local_58;
  
  if (begin._M_current == end._M_current) {
    cVar1 = '\0';
  }
  else {
    do {
      ContainsMatcher<iutest::detail::LtMatcher<int>>::operator()
                (&local_58,(ContainsMatcher<iutest::detail::LtMatcher<int>> *)(this + 8),
                 begin._M_current);
      cVar1 = local_58.m_result;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
        operator_delete(local_58.m_message._M_dataplus._M_p,
                        local_58.m_message.field_2._M_allocated_capacity + 1);
      }
    } while (((bool)cVar1 == false) &&
            (begin._M_current = begin._M_current + 1, begin._M_current != end._M_current));
  }
  return (bool)cVar1;
}

Assistant:

::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        return ElementsAreMatcherBase::WhichIs<0>(m_matchers);
    }